

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void set_add_znode_hash(VecZNode *v,ZNode *z)

{
  ZNode **ppZVar1;
  undefined1 local_50 [4];
  uint h;
  VecZNode vv;
  uint local_20;
  uint n;
  uint j;
  uint i;
  ZNode *z_local;
  VecZNode *v_local;
  
  vv.e[2]._4_4_ = v->n;
  local_50 = (undefined1  [4])0x0;
  if (vv.e[2]._4_4_ != 0) {
    local_20 = 0;
    for (n = (uint)((ulong)z->pn % (ulong)vv.e[2]._4_4_); n < v->n && local_20 < 5;
        n = (n + 1) % vv.e[2]._4_4_) {
      if (v->v[n] == (ZNode *)0x0) {
        v->v[n] = z;
        return;
      }
      local_20 = local_20 + 1;
    }
  }
  if (vv.e[2]._4_4_ == 0) {
    vv.n = 0;
    vv.i = 0;
    v->i = 2;
  }
  else {
    vv._0_8_ = v->v;
    local_50 = (undefined1  [4])v->n;
    v->i = v->i + 2;
  }
  v->n = d_prime2[v->i];
  ppZVar1 = (ZNode **)malloc((ulong)v->n << 3);
  v->v = ppZVar1;
  memset(v->v,0,(ulong)v->n << 3);
  if (vv._0_8_ != 0) {
    set_union_znode(v,(VecZNode *)local_50);
    free((void *)vv._0_8_);
  }
  set_add_znode(v,z);
  return;
}

Assistant:

static void set_add_znode_hash(VecZNode *v, ZNode *z) {
  uint i, j, n = v->n;
  VecZNode vv;
  vec_clear(&vv);
  if (n) {
    uint h = ((uintptr_t)z->pn) % n;
    for (i = h, j = 0; i < v->n && j < SET_MAX_SEQUENTIAL; i = ((i + 1) % n), j++) {
      if (!v->v[i]) {
        v->v[i] = z;
        return;
      }
    }
  }
  if (!n) {
    vv.v = NULL;
    v->i = INITIAL_SET_SIZE_INDEX;
  } else {
    vv.v = (void *)v->v;
    vv.n = v->n;
    v->i = v->i + 2;
  }
  v->n = d_prime2[v->i];
  v->v = MALLOC(v->n * sizeof(void *));
  memset(v->v, 0, v->n * sizeof(void *));
  if (vv.v) {
    set_union_znode(v, &vv);
    FREE(vv.v);
  }
  set_add_znode(v, z);
}